

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O2

void __thiscall Js::ConfigFlagsTable::SetAsBoolean(ConfigFlagsTable *this,Flag flag,Boolean value)

{
  undefined *puVar1;
  code *pcVar2;
  bool bVar3;
  Boolean BVar4;
  Flag currentChildFlag;
  FlagTypes FVar5;
  undefined4 *puVar6;
  void *pvVar7;
  char16_t *this_00;
  
  FVar5 = GetFlagType(flag);
  if (FVar5 != FlagBoolean) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                ,0x449,"(this->GetFlagType(flag) == FlagBoolean)",
                                "flag not a boolean type");
    if (!bVar3) goto LAB_0034a3a7;
    *puVar6 = 0;
  }
  pvVar7 = GetProperty(this,flag);
  if (pvVar7 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                ,0x44c,"(settingAsBoolean != nullptr)","settingAsBoolean != nullptr"
                               );
    if (!bVar3) {
LAB_0034a3a7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  puVar1 = (&FlagNames)[flag];
  this_00 = L"FLAG %s = %d\n";
  Output::VerboseNote(L"FLAG %s = %d\n");
  *(Boolean *)pvVar7 = value;
  if (this->flagIsParent[flag] == true) {
    currentChildFlag = InvalidFlag;
    while( true ) {
      currentChildFlag = GetNextChildFlag((ConfigFlagsTable *)this_00,flag,currentChildFlag);
      if (currentChildFlag == InvalidFlag) break;
      BVar4 = GetDefaultValueAsBoolean((ConfigFlagsTable *)this_00,currentChildFlag);
      Output::VerboseNote(L"FLAG %s = %d - setting child flag %s = %d\n",puVar1,(ulong)value,
                          (&FlagNames)[currentChildFlag],(ulong)(BVar4 && value));
      this_00 = (char16_t *)this;
      SetAsBoolean(this,currentChildFlag,BVar4 && value);
    }
  }
  if (flag == ES6ExperimentalFlag) {
    if (value) {
      EnableExperimentalFlag(this);
      return;
    }
  }
  else if (flag == ES6AllFlag) {
    FlagSetCallback_ES6All(this,value);
    return;
  }
  return;
}

Assistant:

void
    ConfigFlagsTable::SetAsBoolean(Flag flag, Boolean value)
    {
        AssertMsg(this->GetFlagType(flag) == FlagBoolean, "flag not a boolean type");

        Boolean* settingAsBoolean = this->GetAsBoolean(flag);
        Assert(settingAsBoolean != nullptr);

        Output::VerboseNote(_u("FLAG %s = %d\n"), FlagNames[(int) flag], value);
        *settingAsBoolean = value;

        // check if parent flag
        if (this->IsParentFlag(flag))
        {
            // parent flag, will iterate through all child flags
            Flag childFlag = GetNextChildFlag(flag, /* no currentChildFlag */ InvalidFlag);
            while (childFlag != InvalidFlag)
            {
                Boolean childDefaultValue = GetDefaultValueAsBoolean(childFlag);

                // if the parent flag is TRUE, the children flag values are based on their default values
                // if the parent flag is FALSE, the children flag values are FALSE (always - as disabled)
                Boolean childValue = value == TRUE ? childDefaultValue : FALSE;

                Output::VerboseNote(_u("FLAG %s = %d - setting child flag %s = %d\n"), FlagNames[(int) flag], value, FlagNames[(int) childFlag], childValue);
                this->SetAsBoolean(childFlag, childValue);

                // get next child flag
                childFlag = GetNextChildFlag(flag, /* currentChildFlag */ childFlag);
            }
        }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        // in case the flag is marked as 'callback' - to call the method
#define FLAG(type, name, description, defaultValue, parentName, hasCallback) FLAGCALLBACK##hasCallback(type, name)
#define FLAGCALLBACKFALSE(type, name)
#define FLAGCALLBACKTRUE(type, name)    FLAGDOCALLBACK##type(name)

        // define an overload for each FlagTypes - type
            //   * all defaults we don't care about - should assert
#define FLAGDOCALLBACKNumberRange(name)        Assert(false);
#define FLAGDOCALLBACKPhases(name)        Assert(false);
#define FLAGDOCALLBACKString(name)        Assert(false);
#define FLAGDOCALLBACKNumber(name)        Assert(false);
#define FLAGDOCALLBACKNumberSet(name)     Assert(false);
#define FLAGDOCALLBACKNumberPairSet(name) Assert(false);
#define FLAGDOCALLBACKNumberTrioSet(name) Assert(false);
            //   * and those we do care about
#define FLAGDOCALLBACKBoolean(name)       if( flag == name##Flag ) this->FlagSetCallback_##name(value);

#include "ConfigFlagsList.h"

#undef FLAGDOCALLBACKBoolean
#undef FLAGDOCALLBACKNumberRange
#undef FLAGDOCALLBACKNumberPairSet
#undef FLAGDOCALLBACKNumberTrioSet
#undef FLAGDOCALLBACKNumberSet
#undef FLAGDOCALLBACKNumber
#undef FLAGDOCALLBACKString
#undef FLAGDOCALLBACKPhases
#undef FLAGCALLBACKTRUE
#undef FLAGCALLBACKFALSE
#undef FLAG
#endif
    }